

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-test.c++
# Opt level: O0

Pafs * kj::anon_unknown_0::makeCompletionCountingPafs
                 (Pafs *__return_storage_ptr__,uint count,uint *tasksCompleted)

{
  SourceLocation location;
  bool bVar1;
  uint *puVar2;
  Own<kj::PromiseFulfiller<void>,_std::nullptr_t> *params;
  size_t size;
  undefined8 in_stack_fffffffffffffef0;
  Promise<void> local_d0 [2];
  SourceLocation local_c0;
  undefined1 local_a8 [8];
  PromiseFulfillerPair<void> paf;
  Iterator local_88;
  uint value;
  Iterator __end2;
  Iterator __begin2;
  Range<unsigned_int> *__range2;
  undefined1 local_60 [8];
  ArrayBuilder<kj::Own<kj::PromiseFulfiller<void>,_std::nullptr_t>_> fulfillersBuilder;
  ArrayBuilder<kj::Promise<void>_> promisesBuilder;
  uint *tasksCompleted_local;
  uint count_local;
  
  heapArrayBuilder<kj::Promise<void>>
            ((ArrayBuilder<kj::Promise<void>_> *)&fulfillersBuilder.disposer,(kj *)(ulong)count,
             (size_t)tasksCompleted);
  heapArrayBuilder<kj::Own<kj::PromiseFulfiller<void>,decltype(nullptr)>>
            ((ArrayBuilder<kj::Own<kj::PromiseFulfiller<void>,_std::nullptr_t>_> *)local_60,
             (kj *)(ulong)count,size);
  ___end2 = zeroTo<unsigned_int>(count);
  value = (uint)Range<unsigned_int>::begin((Range<unsigned_int> *)&__end2);
  local_88 = Range<unsigned_int>::end((Range<unsigned_int> *)&__end2);
  while( true ) {
    bVar1 = Range<unsigned_int>::Iterator::operator==((Iterator *)&value,&local_88);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    puVar2 = Range<unsigned_int>::Iterator::operator*((Iterator *)&value);
    paf.fulfiller.ptr._4_4_ = *puVar2;
    SourceLocation::SourceLocation
              (&local_c0,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
               ,"makeCompletionCountingPafs",0x345,0x10);
    location.function = (char *)local_c0._16_8_;
    location.fileName = local_c0.function;
    location.lineNumber = (int)in_stack_fffffffffffffef0;
    location.columnNumber = (int)((ulong)in_stack_fffffffffffffef0 >> 0x20);
    newPromiseAndFulfiller<void>(location);
    Promise<void>::
    then<kj::(anonymous_namespace)::makeCompletionCountingPafs(unsigned_int,unsigned_int&)::__0>
              (local_d0,(Type *)local_a8);
    ArrayBuilder<kj::Promise<void>>::add<kj::Promise<void>>
              ((ArrayBuilder<kj::Promise<void>> *)&fulfillersBuilder.disposer,local_d0);
    Promise<void>::~Promise(local_d0);
    params = mv<kj::Own<kj::PromiseFulfiller<void>,decltype(nullptr)>>
                       ((Own<kj::PromiseFulfiller<void>,_std::nullptr_t> *)&paf);
    ArrayBuilder<kj::Own<kj::PromiseFulfiller<void>,decltype(nullptr)>>::
    add<kj::Own<kj::PromiseFulfiller<void>,decltype(nullptr)>>
              ((ArrayBuilder<kj::Own<kj::PromiseFulfiller<void>,decltype(nullptr)>> *)local_60,
               params);
    PromiseFulfillerPair<void>::~PromiseFulfillerPair((PromiseFulfillerPair<void> *)local_a8);
    Range<unsigned_int>::Iterator::operator++((Iterator *)&value);
  }
  ArrayBuilder<kj::Promise<void>_>::finish
            (&__return_storage_ptr__->promises,
             (ArrayBuilder<kj::Promise<void>_> *)&fulfillersBuilder.disposer);
  ArrayBuilder<kj::Own<kj::PromiseFulfiller<void>,_std::nullptr_t>_>::finish
            (&__return_storage_ptr__->fulfillers,
             (ArrayBuilder<kj::Own<kj::PromiseFulfiller<void>,_std::nullptr_t>_> *)local_60);
  ArrayBuilder<kj::Own<kj::PromiseFulfiller<void>,_std::nullptr_t>_>::~ArrayBuilder
            ((ArrayBuilder<kj::Own<kj::PromiseFulfiller<void>,_std::nullptr_t>_> *)local_60);
  ArrayBuilder<kj::Promise<void>_>::~ArrayBuilder
            ((ArrayBuilder<kj::Promise<void>_> *)&fulfillersBuilder.disposer);
  return __return_storage_ptr__;
}

Assistant:

Pafs makeCompletionCountingPafs(uint count, uint& tasksCompleted) {
  auto promisesBuilder = heapArrayBuilder<Promise<void>>(count);
  auto fulfillersBuilder = heapArrayBuilder<Own<PromiseFulfiller<void>>>(count);

  for (auto KJ_UNUSED value: zeroTo(count)) {
    auto paf = newPromiseAndFulfiller<void>();
    promisesBuilder.add(paf.promise.then([&tasksCompleted]() {
      ++tasksCompleted;
    }));
    fulfillersBuilder.add(kj::mv(paf.fulfiller));
  }

  return { promisesBuilder.finish(), fulfillersBuilder.finish() };
}